

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

RuleBasedCollator * __thiscall
icu_63::RuleBasedCollator::operator=(RuleBasedCollator *this,RuleBasedCollator *other)

{
  RuleBasedCollator *other_local;
  RuleBasedCollator *this_local;
  
  if (this != other) {
    SharedObject::copyPtr<icu_63::CollationSettings>(other->settings,&this->settings);
    this->tailoring = other->tailoring;
    SharedObject::copyPtr<icu_63::CollationCacheEntry>(other->cacheEntry,&this->cacheEntry);
    this->data = this->tailoring->data;
    Locale::operator=(&this->validLocale,&other->validLocale);
    this->explicitlySetAttributes = other->explicitlySetAttributes;
    this->actualLocaleIsSameAsValid = other->actualLocaleIsSameAsValid;
  }
  return this;
}

Assistant:

RuleBasedCollator &RuleBasedCollator::operator=(const RuleBasedCollator &other) {
    if(this == &other) { return *this; }
    SharedObject::copyPtr(other.settings, settings);
    tailoring = other.tailoring;
    SharedObject::copyPtr(other.cacheEntry, cacheEntry);
    data = tailoring->data;
    validLocale = other.validLocale;
    explicitlySetAttributes = other.explicitlySetAttributes;
    actualLocaleIsSameAsValid = other.actualLocaleIsSameAsValid;
    return *this;
}